

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11FrameProcessor.cpp
# Opt level: O1

DUPL_RETURN __thiscall
SL::Screen_Capture::X11FrameProcessor::ProcessFrame
          (X11FrameProcessor *this,Monitor *curentmonitorinfo)

{
  Monitor *mointor;
  Display *pDVar1;
  XImage *pXVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  
  pDVar1 = this->SelectedDisplay;
  pXVar2 = this->XImage_;
  uVar3 = *(undefined8 *)(*(long *)(pDVar1 + 0xe8) + 0x10 + (long)*(int *)(pDVar1 + 0xe0) * 0x80);
  mointor = &this->SelectedMonitor;
  iVar4 = OffsetX(mointor);
  iVar5 = OffsetY(mointor);
  iVar4 = XShmGetImage(pDVar1,uVar3,pXVar2,iVar4,iVar5,0xffffffffffffffff);
  if (iVar4 != 0) {
    ProcessCapture<SL::Screen_Capture::CaptureData<std::function<void(SL::Screen_Capture::Image_const&,SL::Screen_Capture::Monitor_const&)>,std::function<void(SL::Screen_Capture::Image_const*,SL::Screen_Capture::MousePoint_const&)>,std::function<std::vector<SL::Screen_Capture::Monitor,std::allocator<SL::Screen_Capture::Monitor>>()>>,SL::Screen_Capture::Monitor>
              (&((this->super_BaseFrameProcessor).Data.
                 super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->ScreenCaptureData,&this->super_BaseFrameProcessor,mointor,
               (uchar *)this->XImage_->data,this->XImage_->bytes_per_line);
  }
  return (uint)(iVar4 == 0);
}

Assistant:

DUPL_RETURN X11FrameProcessor::ProcessFrame(const Monitor& curentmonitorinfo)
    {        
        auto Ret = DUPL_RETURN_SUCCESS;
        if(!XShmGetImage(SelectedDisplay,
                         RootWindow(SelectedDisplay, DefaultScreen(SelectedDisplay)),
                         XImage_,
                         OffsetX(SelectedMonitor),
                         OffsetY(SelectedMonitor),
                         AllPlanes)) {
            return DUPL_RETURN_ERROR_EXPECTED;
        }
        ProcessCapture(Data->ScreenCaptureData, *this, SelectedMonitor, (unsigned char*)XImage_->data, XImage_->bytes_per_line);
        return Ret;
    }